

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::randomizeConstraints(btSoftBody *this)

{
  Link *pLVar1;
  long lVar2;
  ulong uVar3;
  Link *pLVar4;
  undefined8 *puVar5;
  Face *pFVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  Face *pFVar9;
  ulong uVar10;
  long lVar11;
  undefined8 local_68 [8];
  btScalar local_28;
  
  uVar3 = (ulong)(this->m_links).m_size;
  if ((long)uVar3 < 1) {
    uVar10 = 0x3b7f7;
  }
  else {
    uVar10 = 0x3b7f7;
    lVar11 = 0;
    do {
      pLVar4 = (this->m_links).m_data;
      uVar10 = (ulong)((int)uVar10 * 0x19660d + 0x3c6ef35f);
      puVar7 = (undefined8 *)((long)pLVar4->m_n + lVar11 + -0x10);
      pLVar1 = pLVar4 + uVar10 % uVar3;
      puVar5 = puVar7;
      puVar8 = local_68;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar8 = *puVar5;
        puVar5 = puVar5 + 1;
        puVar8 = puVar8 + 1;
      }
      *(btScalar *)((long)(pLVar4->m_c3).m_floats + lVar11 + 0xc) = (pLVar1->m_c3).m_floats[3];
      pLVar4 = pLVar1;
      for (lVar2 = 8; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar7 = (pLVar4->super_Feature).super_Element.m_tag;
        pLVar4 = (Link *)&(pLVar4->super_Feature).m_material;
        puVar7 = puVar7 + 1;
      }
      puVar7 = local_68;
      pLVar4 = pLVar1;
      for (lVar2 = 8; lVar2 != 0; lVar2 = lVar2 + -1) {
        (pLVar4->super_Feature).super_Element.m_tag = (void *)*puVar7;
        puVar7 = puVar7 + 1;
        pLVar4 = (Link *)&(pLVar4->super_Feature).m_material;
      }
      (pLVar1->m_c3).m_floats[3] = local_28;
      lVar11 = lVar11 + 0x48;
    } while (uVar3 * 0x48 != lVar11);
  }
  uVar3 = (ulong)(this->m_faces).m_size;
  if (0 < (long)uVar3) {
    lVar11 = 0;
    do {
      pFVar9 = (this->m_faces).m_data;
      uVar10 = (ulong)((int)uVar10 * 0x19660d + 0x3c6ef35f);
      puVar7 = (undefined8 *)((long)pFVar9->m_n + lVar11 + -0x10);
      pFVar9 = pFVar9 + uVar10 % uVar3;
      puVar5 = puVar7;
      puVar8 = local_68;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar8 = *puVar5;
        puVar5 = puVar5 + 1;
        puVar8 = puVar8 + 1;
      }
      pFVar6 = pFVar9;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        *puVar7 = (pFVar6->super_Feature).super_Element.m_tag;
        pFVar6 = (Face *)&(pFVar6->super_Feature).m_material;
        puVar7 = puVar7 + 1;
      }
      puVar7 = local_68;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        (pFVar9->super_Feature).super_Element.m_tag = (void *)*puVar7;
        puVar7 = puVar7 + 1;
        pFVar9 = (Face *)&(pFVar9->super_Feature).m_material;
      }
      lVar11 = lVar11 + 0x48;
    } while (uVar3 * 0x48 != lVar11);
  }
  return;
}

Assistant:

void			btSoftBody::randomizeConstraints()
{
	unsigned long	seed=243703;
#define NEXTRAND (seed=(1664525L*seed+1013904223L)&0xffffffff)
	int i,ni;

	for(i=0,ni=m_links.size();i<ni;++i)
	{
		btSwap(m_links[i],m_links[NEXTRAND%ni]);
	}
	for(i=0,ni=m_faces.size();i<ni;++i)
	{
		btSwap(m_faces[i],m_faces[NEXTRAND%ni]);
	}
#undef NEXTRAND
}